

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subprocess.h
# Opt level: O3

__pid_t __thiscall subprocess::Popen::wait(Popen *this,void *__stat_loc)

{
  __pid_t __pid;
  int iVar1;
  uint uVar2;
  int *piVar3;
  OSError *this_00;
  long in_FS_OFFSET;
  int status;
  string local_48;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  __pid = this->child_pid_;
  local_48._M_dataplus._M_p = local_48._M_dataplus._M_p & 0xffffffff00000000;
  do {
    iVar1 = waitpid(__pid,(int *)&local_48,0);
  } while (iVar1 == 0);
  if (iVar1 == -1) {
    iVar1 = -1;
  }
  if (iVar1 == -1) {
    piVar3 = __errno_location();
    uVar2 = 0;
    if (*piVar3 != 10) {
      this_00 = (OSError *)__cxa_allocate_exception(0x10);
      local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"waitpid failed","");
      OSError::OSError(this_00,&local_48,*piVar3);
      if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
        __cxa_throw(this_00,&OSError::typeinfo,std::runtime_error::~runtime_error);
      }
      goto LAB_00729274;
    }
  }
  else if (((ulong)local_48._M_dataplus._M_p & 0x7f) == 0) {
    uVar2 = (uint)local_48._M_dataplus._M_p >> 8 & 0xff;
  }
  else {
    uVar2 = 0xff;
    if (0x1ffffff < (int)(((uint)local_48._M_dataplus._M_p & 0x7f) * 0x1000000 + 0x1000000)) {
      uVar2 = (uint)local_48._M_dataplus._M_p & 0x7f;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return uVar2;
  }
LAB_00729274:
  __stack_chk_fail();
}

Assistant:

inline int Popen::wait() noexcept(false)
{
#ifdef __USING_WINDOWS__
  int ret = WaitForSingleObject(process_handle_, INFINITE);

  return 0;
#else
  int ret, status;
  std::tie(ret, status) = util::wait_for_child_exit(child_pid_);
  if (ret == -1) {
    if (errno != ECHILD) throw OSError("waitpid failed", errno);
    return 0;
  }
  if (WIFEXITED(status)) return WEXITSTATUS(status);
  if (WIFSIGNALED(status)) return WTERMSIG(status);
  else return 255;

  return 0;
#endif
}